

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

void Exa3_ManExactSynthesis(Bmc_EsPar_t *pPars)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  abctime aVar9;
  Exa3_Man_t *p;
  Vec_Wec_t *p_00;
  Vec_Wrd_t *pVVar10;
  word *pwVar11;
  int *piVar12;
  void *__s;
  bmcg_sat_solver *s;
  abctime aVar13;
  ulong uVar14;
  Vec_Int_t *pVVar15;
  word *pwVar16;
  word *pIn2;
  long lVar17;
  ulong uVar18;
  int Entry;
  int Entry_00;
  int (*paaiVar19) [6] [32];
  ulong uVar20;
  Bmc_EsPar_t *pBVar21;
  abctime time;
  int iVar22;
  int (*paiVar23) [32];
  uint uVar24;
  int iVar25;
  int (*paiVar26) [32];
  char *pcVar27;
  uint uVar28;
  size_t __size;
  int iVar29;
  long lVar30;
  int (*paaiVar31) [6] [32];
  long lVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  bool bVar36;
  int (*local_1f8) [6] [32];
  int (*local_1e0) [6] [32];
  uint local_1d8;
  int local_1d4;
  int (*local_1c8) [32];
  int pLits [32];
  int local_f8 [16];
  word pTruth [16];
  
  aVar9 = Abc_Clock();
  Abc_TtReadHex(pTruth,pPars->pTtStr);
  iVar22 = pPars->nVars;
  lVar30 = (long)iVar22;
  if (10 < lVar30) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x523,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  iVar4 = pPars->nLutSize;
  if (6 < iVar4) {
    __assert_fail("pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x524,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  p = (Exa3_Man_t *)calloc(1,0x60e0);
  p->pPars = pPars;
  p->nVars = iVar22;
  iVar3 = pPars->nNodes;
  p->nNodes = iVar3;
  p->nLutSize = iVar4;
  uVar24 = ~(-1 << ((byte)iVar4 & 0x1f));
  p->LutMask = uVar24;
  iVar33 = iVar22 + iVar3;
  p->nObjs = iVar33;
  iVar25 = 1 << ((char)iVar22 - 6U & 0x1f);
  if (iVar22 < 7) {
    iVar25 = 1;
  }
  p->nWords = iVar25;
  p->pTruth = pTruth;
  p_00 = Vec_WecStart(iVar33);
  p->vOutLits = p_00;
  if (0x20 < iVar33) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x39b,"int Exa3_ManMarkup(Exa3_Man_t *)");
  }
  p->iVar = iVar3 * uVar24 + 1;
  paaiVar19 = p->VarMarks + lVar30;
  for (; lVar30 < iVar33; lVar30 = lVar30 + 1) {
    paaiVar31 = paaiVar19;
    for (lVar17 = 0; lVar17 < iVar4; lVar17 = lVar17 + 1) {
      if (pPars->fFewerVars == 0) {
        lVar35 = 0;
LAB_004a4b72:
        for (; lVar35 < lVar30 - lVar17; lVar35 = lVar35 + 1) {
          iVar22 = p->iVar;
          iVar4 = Abc_Var2Lit(iVar22,0);
          Vec_WecPush(p_00,(int)lVar35,iVar4);
          p->iVar = iVar22 + 1;
          (*paaiVar31)[0][lVar35] = iVar22;
        }
      }
      else {
        if (lVar17 != 0) {
LAB_004a4b68:
          lVar35 = (long)(int)(iVar4 + ~(uint)lVar17);
          goto LAB_004a4b72;
        }
        iVar22 = p->nObjs;
        local_1f8._0_4_ = (int)lVar30;
        if (iVar22 + -1 != (int)local_1f8) goto LAB_004a4b68;
        iVar4 = p->iVar;
        iVar3 = Abc_Var2Lit(iVar4,0);
        Vec_WecPush(p_00,iVar22 + -2,iVar3);
        p->iVar = iVar4 + 1;
        p->VarMarks[lVar30 + -1][5][(long)iVar22 + 0x1e] = iVar4;
      }
      iVar4 = p->nLutSize;
      paaiVar31 = (int (*) [6] [32])(*paaiVar31 + 1);
    }
    iVar33 = p->nObjs;
    paaiVar19 = paaiVar19 + 1;
  }
  iVar22 = p->iVar;
  iVar25 = 0;
  printf("The number of parameter variables = %d.\n");
  pVVar10 = Vec_WrdStart((iVar33 + 1) * p->nWords);
  p->vInfo = pVVar10;
  iVar4 = p->nVars;
  iVar3 = 0;
  if (0 < iVar4) {
    iVar3 = iVar4;
  }
  for (; iVar3 != iVar25; iVar25 = iVar25 + 1) {
    pwVar11 = Exa3_ManTruth(p,iVar25);
    Abc_TtIthVar(pwVar11,iVar25,iVar4);
  }
  p->vInfo = pVVar10;
  if (pPars->nLutSize == 3) {
    iVar3 = pPars->nNodes << ((byte)pPars->nVars & 0x1f);
    iVar4 = iVar33 * iVar33;
    lVar30 = 0x40;
  }
  else {
    if (pPars->nLutSize != 2) goto LAB_004a4cdb;
    iVar3 = pPars->nNodes << ((byte)pPars->nVars & 0x1f);
    lVar30 = 0x38;
    iVar4 = iVar33;
  }
  uVar24 = iVar4 * iVar33 * iVar3;
  iVar4 = (((int)uVar24 >> 5) + 1) - (uint)((uVar24 & 0x1f) == 0);
  piVar12 = (int *)malloc(0x10);
  *piVar12 = iVar4 * 0x20;
  if (iVar4 == 0) {
    __size = 0;
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar4 << 2;
    __s = malloc(__size);
  }
  *(void **)(piVar12 + 2) = __s;
  piVar12[1] = iVar4 * 0x20;
  memset(__s,0,__size);
  *(int **)((long)(p->VarMarks + -1) + 0x2b8 + lVar30) = piVar12;
LAB_004a4cdb:
  s = bmcg_sat_solver_start();
  p->pSat = s;
  bmcg_sat_solver_set_nvars(s,iVar22);
  if (pPars->RuntimeLim != 0) {
    aVar13 = Abc_Clock();
    bmcg_sat_solver_set_runtime_limit(s,(long)pPars->RuntimeLim * 1000000 + aVar13);
  }
  if ((pTruth[0] & 1) != 0) {
    Abc_TtNot(pTruth,p->nWords);
  }
  iVar22 = pPars->fOnlyAnd;
  lVar30 = (long)p->nVars;
  paaiVar19 = p->VarMarks + lVar30;
  paiVar26 = p->VarMarks[lVar30] + 1;
  for (; uVar14 = (ulong)p->nObjs, lVar30 < (long)uVar14; lVar30 = lVar30 + 1) {
    iVar4 = ((int)lVar30 - p->nVars) * p->LutMask;
    uVar18 = 0;
    local_1f8 = paaiVar19;
    local_1c8 = paiVar26;
    while (iVar3 = p->nLutSize, (long)uVar18 < (long)iVar3) {
      uVar20 = 0;
      for (lVar17 = 0; iVar3 = (int)uVar20, lVar17 < (int)uVar14; lVar17 = lVar17 + 1) {
        iVar33 = (*local_1f8)[0][lVar17];
        if (iVar33 != 0) {
          iVar33 = Abc_Var2Lit(iVar33,0);
          uVar20 = (ulong)(iVar3 + 1);
          pLits[iVar3] = iVar33;
          uVar14 = (ulong)(uint)p->nObjs;
        }
      }
      if (iVar3 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                      ,0x45e,"int Exa3_ManAddCnfStart(Exa3_Man_t *, int)");
      }
      iVar33 = bmcg_sat_solver_addclause(p->pSat,pLits,iVar3);
      if (iVar33 == 0) goto LAB_004a51e1;
      lVar17 = 1;
      uVar14 = 0;
      while (uVar14 != uVar20) {
        lVar35 = lVar17;
        while ((int)lVar35 < iVar3) {
          local_f8[0] = Abc_LitNot(pLits[uVar14]);
          local_f8[1] = Abc_LitNot(pLits[lVar35]);
          iVar33 = bmcg_sat_solver_addclause(p->pSat,local_f8,2);
          lVar35 = lVar35 + 1;
          if (iVar33 == 0) goto LAB_004a51e1;
        }
        lVar17 = lVar17 + 1;
        uVar14 = uVar14 + 1;
      }
      iVar3 = p->nLutSize;
      if (uVar18 == iVar3 - 1) break;
      uVar14 = (ulong)(uint)p->nObjs;
      paiVar23 = local_1c8;
      for (lVar17 = 0; lVar17 < (int)uVar14; lVar17 = lVar17 + 1) {
        if (p->VarMarks[lVar30][uVar18][lVar17] != 0) {
          for (lVar35 = 0; lVar17 + lVar35 < (long)(int)uVar14; lVar35 = lVar35 + 1) {
            if ((*paiVar23)[lVar35] != 0) {
              local_f8[0] = Abc_Var2Lit(p->VarMarks[lVar30][uVar18][lVar17],1);
              local_f8[1] = Abc_Var2Lit((*paiVar23)[lVar35],1);
              iVar3 = bmcg_sat_solver_addclause(p->pSat,local_f8,2);
              if (iVar3 == 0) goto LAB_004a51e1;
              uVar14 = (ulong)(uint)p->nObjs;
            }
          }
        }
        paiVar23 = (int (*) [32])(*paiVar23 + 1);
      }
      local_1f8 = (int (*) [6] [32])(*local_1f8 + 1);
      local_1c8 = local_1c8 + 1;
      uVar18 = uVar18 + 1;
    }
    if (p->pPars->fUseIncr != 0) {
      lVar17 = (long)p->nVars;
      piVar12 = p->VarMarks[lVar17][0] + 1;
      for (; lVar17 < lVar30; lVar17 = lVar17 + 1) {
        iVar3 = p->nObjs;
        for (lVar35 = 0; lVar35 < iVar3; lVar35 = lVar35 + 1) {
          lVar2 = lVar35;
          if (p->VarMarks[lVar30][0][lVar35] != 0) {
            while (lVar32 = lVar2, (int)lVar32 + 1 < iVar3) {
              lVar2 = lVar32 + 1;
              if (piVar12[lVar32] != 0) {
                local_f8[0] = Abc_Var2Lit(p->VarMarks[lVar30][0][lVar35],1);
                local_f8[1] = Abc_Var2Lit(piVar12[lVar32],1);
                iVar3 = bmcg_sat_solver_addclause(p->pSat,local_f8,2);
                if (iVar3 == 0) goto LAB_004a51e1;
                iVar3 = p->nObjs;
              }
            }
          }
        }
        piVar12 = piVar12 + 0xc0;
      }
      iVar3 = p->nLutSize;
    }
    if (iVar3 == 2) {
      iVar3 = 0;
      while (iVar3 != 3) {
        pLits[0] = Abc_Var2Lit(iVar4 + 1,(uint)(iVar3 == 1));
        pLits[1] = Abc_Var2Lit(iVar4 + 2,(uint)(iVar3 == 2));
        pLits[2] = Abc_Var2Lit(iVar4 + 3,(uint)(iVar3 != 0));
        iVar33 = bmcg_sat_solver_addclause(p->pSat,pLits,3);
        iVar3 = iVar3 + 1;
        if (iVar33 == 0) goto LAB_004a51e1;
      }
      if (iVar22 != 0) {
        pLits[0] = Abc_Var2Lit(iVar4 + 1,1);
        pLits[1] = Abc_Var2Lit(iVar4 + 2,1);
        pLits[2] = Abc_Var2Lit(iVar4 + 3,0);
        iVar4 = bmcg_sat_solver_addclause(p->pSat,pLits,3);
        if (iVar4 == 0) goto LAB_004a51e1;
      }
    }
    paaiVar19 = paaiVar19 + 1;
    paiVar26 = paiVar26 + 6;
  }
  iVar22 = 0;
  while (iVar22 < p->nObjs + -1) {
    pVVar15 = Vec_WecEntry(p->vOutLits,iVar22);
    if (pVVar15->nSize < 1) {
      __assert_fail("Vec_IntSize(vArray) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                    ,0x49d,"int Exa3_ManAddCnfStart(Exa3_Man_t *, int)");
    }
    iVar4 = bmcg_sat_solver_addclause(p->pSat,pVVar15->pArray,pVVar15->nSize);
    iVar22 = iVar22 + 1;
    if (iVar4 == 0) {
LAB_004a51e1:
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                    ,0x528,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
    }
  }
  printf("Running exact synthesis for %d-input function with %d %d-input LUTs...\n",
         (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes,(ulong)(uint)p->nLutSize);
  if (pPars->fUseIncr != 0) {
    bmcg_sat_solver_set_nvars(p->pSat,(p->nNodes << ((byte)p->nVars & 0x1f)) + p->iVar);
    iVar22 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
    if (iVar22 != 1) {
      __assert_fail("status == GLUCOSE_SAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                    ,0x52e,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
    }
  }
  local_1d4 = 1;
  uVar24 = 1;
  local_1d8 = 0;
  while (bVar36 = uVar24 == 0xffffffff, !bVar36) {
    if (pPars->fUseIncr == 0) {
      uVar14 = p->pTruth[(int)uVar24 >> 6];
      uVar18 = (ulong)(uint)p->nVars;
      if (p->nVars < 1) {
        uVar18 = 0;
      }
      for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
        p->VarVals[uVar20] = (uint)((uVar24 >> ((uint)uVar20 & 0x1f) & 1) != 0);
      }
      bmcg_sat_solver_set_nvars(p->pSat,(p->nLutSize + 1) * p->nNodes + p->iVar);
      for (lVar30 = (long)p->nVars; uVar18 = (ulong)p->nObjs, lVar30 < (long)uVar18;
          lVar30 = lVar30 + 1) {
        iVar4 = p->nVars;
        iVar3 = p->nLutSize;
        iVar29 = (int)lVar30;
        iVar34 = iVar29 - iVar4;
        iVar33 = p->LutMask;
        iVar25 = p->iVar;
        iVar22 = iVar3 + 1;
        for (lVar17 = 0; lVar17 < iVar3; lVar17 = lVar17 + 1) {
          for (lVar35 = 0; lVar35 < (int)uVar18; lVar35 = lVar35 + 1) {
            if (p->VarMarks[lVar30][lVar17][lVar35] != 0) {
              iVar3 = p->nLutSize;
              iVar6 = p->nVars;
              iVar1 = p->iVar;
              for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
                pLits[0] = Abc_Var2Lit(p->VarMarks[lVar30][lVar17][lVar35],1);
                pLits[1] = Abc_Var2Lit(iVar34 * iVar22 + iVar25 + (int)lVar17,uVar5);
                if (lVar35 < p->nVars) {
                  iVar7 = 2;
                  if (uVar5 != p->VarVals[lVar35]) goto LAB_004a57fe;
                }
                else {
                  pLits[2] = Abc_Var2Lit(p->nLutSize + ((int)lVar35 - iVar6) * (iVar3 + 1) + iVar1,
                                         uVar5 ^ 1);
                  iVar7 = 3;
LAB_004a57fe:
                  iVar7 = bmcg_sat_solver_addclause(p->pSat,pLits,iVar7);
                  if (iVar7 == 0) {
                    bVar36 = false;
                    goto LAB_004a5bb4;
                  }
                }
              }
              uVar18 = (ulong)(uint)p->nObjs;
            }
          }
          iVar3 = p->nLutSize;
        }
        iVar25 = iVar25 + (iVar29 - iVar4) * iVar22;
        for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
          if ((p->nObjs + -1 != iVar29) || (uVar5 != ((uint)(uVar14 >> ((byte)uVar24 & 0x3f)) & 1)))
          {
            for (uVar28 = 0; (int)uVar28 <= p->LutMask; uVar28 = uVar28 + 1) {
              if ((uVar5 ^ 1) != 0 || uVar28 != 0) {
                for (uVar18 = 0; uVar8 = (uint)uVar18, (int)uVar8 < p->nLutSize; uVar18 = uVar18 + 1
                    ) {
                  iVar22 = Abc_Var2Lit(uVar8 + iVar25,(uint)((uVar28 >> (uVar8 & 0x1f) & 1) != 0));
                  pLits[uVar18] = iVar22;
                }
                if (p->nObjs + -1 != iVar29) {
                  iVar22 = Abc_Var2Lit(uVar8 + iVar25,uVar5 ^ 1);
                  uVar20 = uVar18 & 0xffffffff;
                  uVar18 = (ulong)(uVar8 + 1);
                  pLits[uVar20] = iVar22;
                }
                iVar22 = (int)uVar18;
                if (uVar28 != 0) {
                  iVar4 = Abc_Var2Lit(uVar28 + iVar33 * iVar34,uVar5);
                  lVar17 = (long)iVar22;
                  iVar22 = iVar22 + 1;
                  pLits[lVar17] = iVar4;
                }
                if (p->nLutSize + 2 < iVar22) {
                  __assert_fail("nLits <= p->nLutSize+2",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                                ,0x4d5,"int Exa3_ManAddCnf(Exa3_Man_t *, int)");
                }
                iVar22 = bmcg_sat_solver_addclause(p->pSat,pLits,iVar22);
                if (iVar22 == 0) {
                  bVar36 = false;
                  goto LAB_004a5bb4;
                }
              }
            }
          }
        }
      }
      p->iVar = p->iVar + (p->nLutSize + 1) * p->nNodes;
    }
    else {
      uVar14 = p->pTruth[(int)uVar24 >> 6];
      iVar22 = p->nNodes;
      iVar4 = p->iVar;
      uVar5 = p->nVars;
      lVar30 = (long)(int)uVar5;
      uVar18 = 0;
      if (0 < (int)uVar5) {
        uVar18 = (ulong)uVar5;
      }
      for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
        p->VarVals[uVar20] = (uint)((uVar24 >> ((uint)uVar20 & 0x1f) & 1) != 0);
      }
      iVar4 = iVar22 * uVar24 + iVar4;
      local_1e0 = p->VarMarks + lVar30;
      for (; lVar30 < p->nObjs; lVar30 = lVar30 + 1) {
        iVar22 = p->nVars;
        iVar3 = p->LutMask;
        for (lVar17 = 0; iVar33 = (int)lVar30, lVar17 < p->nLutSize; lVar17 = lVar17 + 1) {
          iVar33 = Exa3_ManFindFanin(p,iVar33,(int)lVar17);
          pLits[lVar17] = iVar33;
        }
        pBVar21 = p->pPars;
        iVar25 = pBVar21->nLutSize;
        if (iVar25 == 2) {
          iVar25 = pBVar21->nNodes;
          iVar34 = pBVar21->nVars;
          p->nUsed[0] = p->nUsed[0] + 1;
          if (((pLits[0] <= pLits[1]) || (lVar30 <= pLits[1])) || (lVar30 <= pLits[0])) {
            __assert_fail("i < n && j < n && i < j",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                          ,0x370,"int Exa3_ManIsUsed2(Exa3_Man_t *, int, int, int, int)");
          }
          iVar34 = (((iVar25 * uVar24 + iVar33) - iVar34) * p->nObjs + pLits[1]) * p->nObjs +
                   pLits[0];
          iVar25 = Vec_BitEntry(p->vUsed2,iVar34);
          if (iVar25 == 0) {
            p->nUsed[1] = p->nUsed[1] + 1;
            Vec_BitWriteEntry(p->vUsed2,iVar34,Entry);
            pBVar21 = p->pPars;
            iVar25 = pBVar21->nLutSize;
            goto LAB_004a5405;
          }
        }
        else {
LAB_004a5405:
          if (iVar25 == 3) {
            iVar25 = pBVar21->nNodes;
            iVar34 = pBVar21->nVars;
            iVar29 = p->nObjs;
            p->nUsed[0] = p->nUsed[0] + 1;
            if (((pLits[0] <= pLits[1]) || (pLits[1] <= pLits[2])) ||
               ((lVar30 <= pLits[2] || ((lVar30 <= pLits[1] || (lVar30 <= pLits[0])))))) {
              __assert_fail("i < n && j < n && k < n && i < j && j < k",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                            ,0x37c,"int Exa3_ManIsUsed3(Exa3_Man_t *, int, int, int, int, int)");
            }
            iVar34 = ((((iVar25 * uVar24 + iVar33) - iVar34) * iVar29 + pLits[2]) * iVar29 +
                     pLits[1]) * iVar29 + pLits[0];
            iVar25 = Vec_BitEntry(p->vUsed3,iVar34);
            if (iVar25 != 0) goto LAB_004a549c;
            p->nUsed[1] = p->nUsed[1] + 1;
            Vec_BitWriteEntry(p->vUsed3,iVar34,Entry_00);
          }
          for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
            if ((p->nObjs + -1 != iVar33) ||
               (uVar5 != ((uint)(uVar14 >> ((byte)uVar24 & 0x3f)) & 1))) {
              for (uVar28 = 0; (int)uVar28 <= p->LutMask; uVar28 = uVar28 + 1) {
                if (uVar5 != 1 || uVar28 != 0) {
                  lVar17 = 0;
                  iVar25 = 0;
                  paaiVar19 = local_1e0;
                  while( true ) {
                    iVar34 = p->nLutSize;
                    iVar29 = iVar25;
                    if (iVar34 <= lVar17) break;
                    iVar34 = pLits[lVar17];
                    iVar6 = Abc_Var2Lit((*paaiVar19)[0][iVar34],1);
                    iVar29 = iVar25 + 1;
                    local_f8[iVar25] = iVar6;
                    uVar8 = (uint)((uVar28 >> ((uint)lVar17 & 0x1f) & 1) != 0);
                    if (iVar34 < p->nVars) {
                      iVar25 = iVar29;
                      if (p->VarVals[iVar34] != uVar8) {
                        iVar34 = p->nLutSize;
                        break;
                      }
                    }
                    else {
                      iVar34 = Abc_Var2Lit((iVar34 + iVar4) - p->nVars,uVar8);
                      iVar25 = iVar25 + 2;
                      local_f8[iVar29] = iVar34;
                    }
                    lVar17 = lVar17 + 1;
                    paaiVar19 = (int (*) [6] [32])(*paaiVar19 + 1);
                  }
                  if (iVar34 <= (int)(uint)lVar17) {
                    if (p->nObjs + -1 != iVar33) {
                      iVar25 = Abc_Var2Lit((iVar4 + iVar33) - p->nVars,uVar5 ^ 1);
                      lVar17 = (long)iVar29;
                      iVar29 = iVar29 + 1;
                      local_f8[lVar17] = iVar25;
                    }
                    if (uVar28 != 0) {
                      iVar25 = Abc_Var2Lit(uVar28 + (iVar33 - iVar22) * iVar3,uVar5);
                      lVar17 = (long)iVar29;
                      iVar29 = iVar29 + 1;
                      local_f8[lVar17] = iVar25;
                    }
                    if (p->nLutSize * 2 + 2 < iVar29) {
                      __assert_fail("nLits <= 2*p->nLutSize+2",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                                    ,0x50c,"int Exa3_ManAddCnf2(Exa3_Man_t *, int)");
                    }
                    iVar25 = bmcg_sat_solver_addclause(p->pSat,local_f8,iVar29);
                    if (iVar25 == 0) {
                      bVar36 = false;
                      goto LAB_004a5bb4;
                    }
                  }
                }
              }
            }
          }
        }
LAB_004a549c:
        local_1e0 = local_1e0 + 1;
      }
    }
    local_1d4 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
    if ((pPars->fVerbose != 0) && ((pPars->fUseIncr == 0 || (local_1d8 % 100 == 0)))) {
      aVar13 = Abc_Clock();
      Exa3_ManPrint(p,local_1d8,uVar24,aVar13 - aVar9);
    }
    if (local_1d4 + 1U < 2) goto LAB_004a5bb4;
    for (iVar22 = p->nVars; iVar22 < p->nObjs; iVar22 = iVar22 + 1) {
      iVar4 = p->nVars;
      iVar3 = p->LutMask;
      for (lVar30 = 0; lVar30 < p->nLutSize; lVar30 = lVar30 + 1) {
        iVar33 = Exa3_ManFindFanin(p,iVar22,(int)lVar30);
        pwVar11 = Exa3_ManTruth(p,iVar33);
        *(word **)(pLits + lVar30 * 2) = pwVar11;
      }
      pwVar11 = Exa3_ManTruth(p,iVar22);
      Abc_TtConst0(pwVar11,p->nWords);
      for (uVar24 = 1; (int)uVar24 <= p->LutMask; uVar24 = uVar24 + 1) {
        iVar33 = bmcg_sat_solver_read_cex_varvalue(p->pSat,uVar24 + (iVar22 - iVar4) * iVar3);
        if (iVar33 != 0) {
          pwVar11 = Exa3_ManTruth(p,p->nObjs);
          uVar14 = (ulong)(uint)p->nWords;
          if (p->nWords < 1) {
            uVar14 = 0;
          }
          for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
            pwVar11[uVar18] = 0xffffffffffffffff;
          }
          for (lVar30 = 0; lVar30 < p->nLutSize; lVar30 = lVar30 + 1) {
            pwVar11 = Exa3_ManTruth(p,p->nObjs);
            pwVar16 = Exa3_ManTruth(p,p->nObjs);
            Abc_TtAndCompl(pwVar11,pwVar16,0,*(word **)(pLits + lVar30 * 2),
                           (uint)((~uVar24 >> ((uint)lVar30 & 0x1f) & 1) != 0),p->nWords);
          }
          pwVar11 = Exa3_ManTruth(p,iVar22);
          pwVar16 = Exa3_ManTruth(p,iVar22);
          pIn2 = Exa3_ManTruth(p,p->nObjs);
          Abc_TtOr(pwVar11,pwVar16,pIn2,p->nWords);
        }
      }
    }
    pwVar11 = Exa3_ManTruth(p,p->nObjs + -1);
    iVar22 = p->nVars;
    uVar24 = Abc_TtFindFirstDiffBit(pwVar11,p->pTruth,iVar22);
    if (1 << ((byte)iVar22 & 0x1f) <= (int)uVar24) {
      __assert_fail("iMint < (1 << p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                    ,0x415,"int Exa3_ManEval(Exa3_Man_t *)");
    }
    local_1d8 = local_1d8 + 1;
  }
  bVar36 = true;
LAB_004a5bb4:
  if ((pPars->fVerbose != 0) && (local_1d4 != 0)) {
    aVar13 = Abc_Clock();
    Exa3_ManPrint(p,local_1d8,uVar24,aVar13 - aVar9);
  }
  if (bVar36) {
    printf("Realization of given %d-input function using %d %d-input LUTs:\n",(ulong)(uint)p->nVars,
           (ulong)(uint)p->nNodes,(ulong)(uint)p->nLutSize);
    uVar24 = p->nObjs;
    uVar5 = uVar24;
    while( true ) {
      uVar24 = uVar24 - 1;
      iVar22 = p->nVars;
      if ((int)uVar5 <= iVar22) break;
      uVar28 = uVar5 - 1;
      iVar4 = p->LutMask;
      printf("%02d = %d\'b",(ulong)uVar28,(ulong)(uint)(1 << ((byte)p->nLutSize & 0x1f)));
      iVar3 = p->LutMask;
      while (0 < iVar3) {
        iVar33 = (uVar24 - iVar22) * iVar4 + iVar3;
        iVar3 = iVar3 + -1;
        uVar8 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar33);
        uVar14 = (ulong)(uVar8 == 0);
        if (uVar5 != p->nObjs) {
          uVar14 = (ulong)uVar8;
        }
        if ((pTruth[0] & 1) == 0) {
          uVar14 = (ulong)uVar8;
        }
        printf("%d",uVar14);
      }
      pcVar27 = "0(";
      if (uVar5 == p->nObjs) {
        pcVar27 = "1(";
      }
      if ((pTruth[0] & 1) == 0) {
        pcVar27 = "0(";
      }
      printf(pcVar27);
      iVar22 = p->nLutSize;
      while (0 < iVar22) {
        iVar22 = iVar22 + -1;
        uVar5 = Exa3_ManFindFanin(p,uVar28,iVar22);
        if (((int)uVar5 < 0) || (p->nVars <= (int)uVar5)) {
          pcVar27 = " %02d";
        }
        else {
          uVar5 = uVar5 + 0x61;
          pcVar27 = " %c";
        }
        printf(pcVar27,(ulong)uVar5);
      }
      puts(" )");
      uVar5 = uVar28;
    }
  }
  else if (local_1d4 == 0) {
    printf("The problem timed out after %d sec.\n",(ulong)(uint)pPars->RuntimeLim);
  }
  else {
    puts("The problem has no solution.");
  }
  printf("Added = %d.  Tried = %d.  ",(ulong)(uint)p->nUsed[1],(ulong)(uint)p->nUsed[0]);
  bmcg_sat_solver_stop(p->pSat);
  Vec_WrdFree(p->vInfo);
  Vec_BitFreeP(&p->vUsed2);
  Vec_BitFreeP(&p->vUsed3);
  Vec_WecFree(p->vOutLits);
  free(p);
  aVar13 = Abc_Clock();
  Abc_PrintTime(0x7a9015,(char *)(aVar13 - aVar9),time);
  return;
}

Assistant:

void Exa3_ManExactSynthesis( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa3_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    assert( pPars->nLutSize <= 6 );
    p = Exa3_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa3_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d %d-input LUTs...\n", p->nVars, p->nNodes, p->nLutSize );
    if ( pPars->fUseIncr ) 
    {
        bmcg_sat_solver_set_nvars( p->pSat, p->iVar + p->nNodes*(1 << p->nVars) );
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        assert( status == GLUCOSE_SAT );
    }
    for ( i = 0; iMint != -1; i++ )
    {
        if ( pPars->fUseIncr ? !Exa3_ManAddCnf2( p, iMint ) : !Exa3_ManAddCnf( p, iMint ) )
            break;
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( pPars->fVerbose && (!pPars->fUseIncr || i % 100 == 0) )
            Exa3_ManPrint( p, i, iMint, Abc_Clock() - clkTotal );
        if ( status == GLUCOSE_UNSAT || status == GLUCOSE_UNDEC )
            break;
        iMint = Exa3_ManEval( p );
    }
    if ( pPars->fVerbose && status != GLUCOSE_UNDEC )
        Exa3_ManPrint( p, i, iMint, Abc_Clock() - clkTotal );
    if ( iMint == -1 )
        Exa3_ManPrintSolution( p, fCompl );
    else if ( status == GLUCOSE_UNDEC )
        printf( "The problem timed out after %d sec.\n", pPars->RuntimeLim );
    else 
        printf( "The problem has no solution.\n" );
    printf( "Added = %d.  Tried = %d.  ", p->nUsed[1], p->nUsed[0] );
    Exa3_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}